

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O2

void luaJIT_profile_start(lua_State *L,char *mode,luaJIT_profile_callback cb,void *data)

{
  uint uVar1;
  int interval;
  uint uVar2;
  byte *pbVar3;
  itimerval tm;
  sigaction local_c8;
  
  uVar2 = 10;
  while( true ) {
    pbVar3 = (byte *)mode + 1;
    if (*mode == 0) break;
    uVar1 = (uint)(byte)*mode;
    mode = (char *)pbVar3;
    if ((uVar1 == 0x66) || (uVar1 == 0x6c)) {
      *(uint *)((L->glref).ptr64 + 0xefc) = uVar1;
      lj_trace_flushall(L);
    }
    else if (uVar1 == 0x69) {
      uVar2 = 0;
      for (; (byte)(*pbVar3 - 0x30) < 10; pbVar3 = pbVar3 + 1) {
        uVar2 = (uint)(byte)(*pbVar3 - 0x30) + uVar2 * 10;
      }
      mode = (char *)pbVar3;
      if ((int)uVar2 < 2) {
        uVar2 = 1;
      }
    }
  }
  if ((profile_state.g == (global_State *)0x0) ||
     (luaJIT_profile_stop(L), profile_state.g == (global_State *)0x0)) {
    profile_state.g = (global_State *)(L->glref).ptr64;
    profile_state.samples = 0;
    profile_state.sb.w = (char *)0x0;
    profile_state.sb.e = (char *)0x0;
    profile_state.sb.b = (char *)0x0;
    tm.it_interval.tv_sec = (ulong)uVar2 / 1000;
    tm.it_interval.tv_usec = (__suseconds_t)((uVar2 % 1000) * 1000);
    profile_state.cb = cb;
    profile_state.data = data;
    profile_state.sb.L.ptr64 = (uint64_t)L;
    profile_state.interval = uVar2;
    tm.it_value.tv_sec = tm.it_interval.tv_sec;
    tm.it_value.tv_usec = tm.it_interval.tv_usec;
    setitimer(ITIMER_PROF,(itimerval *)&tm,(itimerval *)0x0);
    local_c8.sa_flags = 0x10000000;
    local_c8.__sigaction_handler.sa_handler = profile_signal;
    sigemptyset(&local_c8.sa_mask);
    sigaction(0x1b,&local_c8,(sigaction *)&profile_state.oldsa);
  }
  return;
}

Assistant:

LUA_API void luaJIT_profile_start(lua_State *L, const char *mode,
				  luaJIT_profile_callback cb, void *data)
{
  ProfileState *ps = &profile_state;
  int interval = LJ_PROFILE_INTERVAL_DEFAULT;
  while (*mode) {
    int m = *mode++;
    switch (m) {
    case 'i':
      interval = 0;
      while (*mode >= '0' && *mode <= '9')
	interval = interval * 10 + (*mode++ - '0');
      if (interval <= 0) interval = 1;
      break;
#if LJ_HASJIT
    case 'l': case 'f':
      L2J(L)->prof_mode = m;
      lj_trace_flushall(L);
      break;
#endif
    default:  /* Ignore unknown mode chars. */
      break;
    }
  }
  if (ps->g) {
    luaJIT_profile_stop(L);
    if (ps->g) return;  /* Profiler in use by another VM. */
  }
  ps->g = G(L);
  ps->interval = interval;
  ps->cb = cb;
  ps->data = data;
  ps->samples = 0;
  lj_buf_init(L, &ps->sb);
  profile_timer_start(ps);
}